

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

string * disassemble_spirv_asm_abi_cxx11_
                   (string *__return_storage_ptr__,VkShaderModuleCreateInfo *create_info)

{
  bool bVar1;
  allocator local_45;
  undefined4 local_44;
  uint32_t options;
  SpirvTools tools;
  string str;
  VkShaderModuleCreateInfo *create_info_local;
  
  std::__cxx11::string::string((string *)&tools);
  spvtools::SpirvTools::SpirvTools((SpirvTools *)&stack0xffffffffffffffc0,SPV_ENV_VULKAN_1_2);
  local_44 = 0x40;
  bVar1 = spvtools::SpirvTools::Disassemble
                    ((SpirvTools *)&stack0xffffffffffffffc0,create_info->pCode,
                     create_info->codeSize >> 2,(string *)&tools,0x40);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tools);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_45);
    std::allocator<char>::~allocator((allocator<char> *)&local_45);
  }
  spvtools::SpirvTools::~SpirvTools((SpirvTools *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&tools);
  return __return_storage_ptr__;
}

Assistant:

static string disassemble_spirv_asm(const VkShaderModuleCreateInfo *create_info)
{
	string str;
	spvtools::SpirvTools tools(SPV_ENV_VULKAN_1_2);
	const uint32_t options = spvtools::SpirvTools::kDefaultDisassembleOption &
							 ~SPV_BINARY_TO_TEXT_OPTION_NO_HEADER;
	if (!tools.Disassemble(create_info->pCode, create_info->codeSize / sizeof(uint32_t), &str, options))
		return "";
	return str;
}